

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O2

void __thiscall Nussinov::lambda_swipe(Nussinov *this,double incr,ostream *fout,string *outfile)

{
  pointer *ppiVar1;
  _Head_base<0UL,_double,_false> _Var2;
  int iVar3;
  ostream *poVar4;
  size_type __n;
  long lVar5;
  double dVar6;
  double dVar7;
  vector<int,_std::allocator<int>_> rna_n;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  NussinovAlgorithm F;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  temp;
  string rna;
  string local_70;
  string local_50;
  
  dVar6 = ceil(1.0 / incr + 1.0);
  poVar4 = std::operator<<((ostream *)&std::cout,"size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)dVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  __n = (size_type)(int)dVar6;
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&lambda_buffer,__n,(value_type_conflict2 *)&F,(allocator_type *)&temp);
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&F_buffer,__n,(value_type_conflict2 *)&F,(allocator_type *)&temp);
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&CAI_buffer,__n,(value_type_conflict2 *)&F,(allocator_type *)&temp);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&dataset,3,(allocator_type *)&F);
  temp.
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&temp.
                 super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  temp.
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  lVar5 = 0;
  temp.
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = '\0';
  temp.
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  rna._M_dataplus._M_p = (pointer)&rna.field_2;
  rna._M_string_length = 0;
  rna.field_2._M_local_buf[0] = '\0';
  for (dVar6 = 0.0; dVar6 < 1.001; dVar6 = dVar6 + incr) {
    std::operator<<(fout,"lambda: ");
    poVar4 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    nussinov_CAI_abi_cxx11_
              ((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&F,this,dVar6,fout);
    std::
    tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&temp,(type)&F);
    std::__cxx11::string::~string((string *)&F);
    _Var2 = temp.
            super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<0UL,_double,_false>;
    std::__cxx11::string::_M_assign((string *)&rna);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &rna_n.super__Vector_base<int,_std::allocator<int>_>,rna._M_string_length,
               (allocator_type *)&F);
    std::__cxx11::string::string((string *)&local_50,(string *)&rna);
    transform2num((vector<int,_std::allocator<int>_> *)
                  &rna_n.super__Vector_base<int,_std::allocator<int>_>,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    dVar7 = getCAI_s((vector<int,_std::allocator<int>_> *)
                     &rna_n.super__Vector_base<int,_std::allocator<int>_>,&this->protein);
    *(double *)
     ((long)lambda_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5) = dVar6;
    NussinovAlgorithm::NussinovAlgorithm
              (&F,(vector<int,_std::allocator<int>_> *)
                  &rna_n.super__Vector_base<int,_std::allocator<int>_>,
               (int)((ulong)((long)rna_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)rna_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2),this->g);
    poVar4 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>(_Var2._M_head_impl);
    std::operator<<(poVar4," ");
    dVar7 = (double)(~-(ulong)(dVar6 == 1.0) & (ulong)dVar7);
    poVar4 = std::ostream::_M_insert<double>(dVar7);
    poVar4 = std::operator<<(poVar4," ");
    iVar3 = NussinovAlgorithm::nussinov
                      (&F,0,(int)((ulong)((long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 2) + -1)
    ;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4," ");
    iVar3 = NussinovAlgorithm::nussinov
                      (&F,0,(int)((ulong)((long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 2) + -1)
    ;
    poVar4 = std::ostream::_M_insert<double>((double)iVar3 * dVar6 + (1.0 - dVar6) * dVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = NussinovAlgorithm::nussinov
                      (&F,0,(int)((ulong)((long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)rna_n.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 2) + -1)
    ;
    *(ulong *)((long)F_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar5) =
         ~-(ulong)(dVar6 == 0.0) & (ulong)(double)iVar3;
    *(double *)
     ((long)CAI_buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5) = dVar7;
    NussinovAlgorithm::~NussinovAlgorithm(&F);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&rna_n.super__Vector_base<int,_std::allocator<int>_>);
    lVar5 = lVar5 + 8;
  }
  ppiVar1 = &F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x140214;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)ppiVar1,&lambda_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             dataset.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&F);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)ppiVar1);
  ppiVar1 = &F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)anon_var_dwarf_1c23c;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)ppiVar1,&F_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&F);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)ppiVar1);
  ppiVar1 = &F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  F.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x140922;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)ppiVar1,&CAI_buffer);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (dataset.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&F);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)ppiVar1);
  std::__cxx11::string::string((string *)&local_70,(string *)outfile);
  write_csv(&local_70,&dataset);
  std::__cxx11::string::~string((string *)&local_70);
  poVar4 = std::operator<<((ostream *)&std::cout,"swipe done");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&rna);
  std::__cxx11::string::~string((string *)&temp);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&dataset);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&CAI_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&F_buffer.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lambda_buffer.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Nussinov::lambda_swipe(double incr, ostream &fout, string outfile) {
    int size = ceil(1/incr + 1);
    cout << "size: " << size << endl;
    vector<double> lambda_buffer(size, 0);
    vector<double> F_buffer(size, 0);
    vector<double> CAI_buffer(size, 0);
    vector<pair<string, vector<double>>> dataset(3);
    int index = 0;
    double O;
    double CAI = 0;
    tuple<double, string> temp;

    string rna;
    double lambda = 0;
    while (lambda < 1.001) {
        fout << "lambda: " << lambda << endl;
        temp = nussinov_CAI(lambda, fout);
        O = get<0>(temp);
        rna = get<1>(temp);
        vector<int> rna_n(rna.size());
        transform2num(rna_n, rna);
        CAI = getCAI_s(rna_n, protein);
        if (lambda == 1) CAI = 0;
        lambda_buffer[index] = lambda;
        NussinovAlgorithm F = NussinovAlgorithm(rna_n, rna_n.size(), g);
        cout << lambda << " " << O << " " << CAI << " " << F.nussinov(0, rna_n.size()-1) << " " << lambda*(F.nussinov(0, rna_n.size()-1))+(1-lambda)*CAI << endl;
        F_buffer[index] = F.nussinov(0, rna_n.size()-1);
        if (lambda == 0) F_buffer[index] = 0;
        CAI_buffer[index] = CAI;
        index++;
        lambda += incr;
    }
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("F", F_buffer);
    dataset[2] = make_pair("CAI", CAI_buffer);
    write_csv(outfile, dataset);
    cout << "swipe done" << endl;
}